

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Report_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IO_Report_PDU::ClearStandardVariableRecords(IO_Report_PDU *this)

{
  IO_Report_PDU *this_local;
  
  (this->super_IO_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&this->m_vStdVarRecs);
  this->m_ui16NumStdVarRec = 0;
  return;
}

Assistant:

void IO_Report_PDU::ClearStandardVariableRecords()
{
    // Reset the PDU length.
    m_ui16PDULength = IO_REPORT_PDU_SIZE;

    m_vStdVarRecs.clear();
    m_ui16NumStdVarRec = 0;
}